

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void cmCursesMainForm::UpdateProgress(char *msg,float prog,void *vp)

{
  int iVar1;
  cmCursesMainForm *cm;
  char tmp [1024];
  char acStack_418 [1032];
  
  if (vp != (void *)0x0) {
    if (0.0 <= prog) {
      sprintf(acStack_418,"%s %i%%",msg,(ulong)(uint)(int)(prog * 100.0));
      msg = acStack_418;
    }
    (**(code **)(*vp + 0x30))(vp,msg);
    PrintKeys((cmCursesMainForm *)vp,1);
    move(1,1);
    if (_stdscr == 0) {
      iVar1 = -1;
    }
    else {
      iVar1 = *(short *)(_stdscr + 4) + 1;
    }
    wtouchln(_stdscr,0,iVar1,1);
    refresh();
  }
  return;
}

Assistant:

void cmCursesMainForm::UpdateProgress(const char *msg, float prog, void* vp)
{
  cmCursesMainForm* cm = static_cast<cmCursesMainForm*>(vp);
  if ( !cm )
    {
    return;
    }
  char tmp[1024];
  const char *cmsg = tmp;
  if ( prog >= 0 )
    {
    sprintf(tmp, "%s %i%%",msg,(int)(100*prog));
    }
  else
    {
    cmsg = msg;
    }
  cm->UpdateStatusBar(cmsg);
  cm->PrintKeys(1);
  curses_move(1,1);
  touchwin(stdscr);
  refresh();
}